

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O3

SRC_ERROR sinc_multichan_vari_process(SRC_STATE *state,SRC_DATA *data)

{
  double *__s;
  double *__s_00;
  size_t __n;
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  SINC_FILTER *filter;
  float *pfVar6;
  float *pfVar7;
  coeff_t *pcVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int ch;
  SRC_ERROR SVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int half_filter_chan_len;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  
  filter = (SINC_FILTER *)state->private_data;
  if (filter == (SINC_FILTER *)0x0) {
    return SRC_ERR_NO_PRIVATE;
  }
  uVar3 = state->channels;
  uVar17 = (ulong)uVar3;
  lVar21 = (long)(int)uVar3;
  filter->in_count = data->input_frames * lVar21;
  lVar16 = data->output_frames * lVar21;
  filter->out_count = lVar16;
  filter->out_gen = 0;
  filter->in_used = 0;
  dVar28 = state->last_ratio;
  if (dVar28 < 0.00390625) {
    return SRC_ERR_BAD_INTERNAL_STATE;
  }
  if (256.0 < dVar28) {
    return SRC_ERR_BAD_INTERNAL_STATE;
  }
  dVar30 = dVar28;
  if (data->src_ratio <= dVar28) {
    dVar30 = data->src_ratio;
  }
  dVar27 = state->last_position;
  dVar34 = dVar27 - (double)(int)ROUND(dVar27);
  dVar34 = (double)(~-(ulong)(dVar34 < 0.0) & (ulong)dVar34 |
                   (ulong)(dVar34 + 1.0) & -(ulong)(dVar34 < 0.0));
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar34;
  iVar23 = filter->b_len;
  lVar19 = (long)(int)((int)ROUND(dVar27 - dVar34) * uVar3 + filter->b_current) % (long)iVar23;
  filter->b_current = (int)lVar19;
  if (0 < lVar16) {
    dVar34 = ((double)filter->coeff_half_len + 2.0) / (double)filter->index_inc;
    dVar27 = 1.0 / dVar28;
    half_filter_chan_len =
         ((int)ROUND((double)(-(ulong)(dVar30 < 1.0) & (ulong)(dVar34 / dVar30) |
                             ~-(ulong)(dVar30 < 1.0) & (ulong)dVar34)) + 1) * uVar3;
    __s = filter->left_calc;
    __s_00 = filter->right_calc;
    iVar22 = filter->b_end;
LAB_00104bf0:
    dVar34 = auVar35._0_8_;
    iVar24 = (int)lVar19;
    if (((iVar22 - iVar24) + iVar23) % iVar23 <= half_filter_chan_len) {
      SVar11 = prepare_data(filter,(int)uVar17,data,half_filter_chan_len);
      state->error = SVar11;
      if (SVar11 != SRC_ERR_NO_ERROR) {
        return SVar11;
      }
      iVar24 = filter->b_current;
      iVar22 = filter->b_end;
      iVar23 = filter->b_len;
      if (((iVar22 - iVar24) + iVar23) % iVar23 <= half_filter_chan_len) goto LAB_00105118;
    }
    if ((filter->b_real_end < 0) ||
       ((double)iVar24 + dVar34 + dVar27 + 1e-20 < (double)filter->b_real_end)) {
      lVar16 = filter->out_count;
      if (lVar16 < 1) {
        lVar21 = filter->out_gen;
      }
      else {
        dVar30 = state->last_ratio;
        lVar21 = filter->out_gen;
        if (1e-10 < ABS(dVar30 - data->src_ratio)) {
          dVar28 = ((data->src_ratio - dVar30) * (double)lVar21) / (double)lVar16 + dVar30;
        }
      }
      iVar4 = filter->index_inc;
      uVar31 = SUB84(dVar28,0);
      uVar32 = (undefined4)((ulong)dVar28 >> 0x20);
      if (1.0 <= dVar28) {
        uVar31 = 0;
        uVar32 = 0x3ff00000;
      }
      dVar30 = (double)CONCAT44(uVar32,uVar31) * (double)iVar4;
      uVar14 = (uint)ROUND(dVar30 * 4096.0);
      iVar20 = (int)ROUND(dVar34 * dVar30 * 4096.0);
      uVar3 = state->channels;
      pfVar6 = data->data_out;
      iVar5 = filter->coeff_half_len;
      iVar12 = (iVar5 * 0x1000 - iVar20) / (int)uVar14;
      uVar25 = iVar12 * uVar14 + iVar20;
      uVar26 = iVar24 - iVar12 * uVar3;
      if ((int)uVar26 < 0) {
        if ((((int)uVar3 < 1) || (uVar15 = (~uVar26 + uVar3) / uVar3, (int)uVar14 < 1)) ||
           ((int)uVar25 < 0)) {
          __assert_fail("divident >= 0 && divisor > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0xa0,"int int_div_ceil(int, int)");
        }
        if (((uVar14 + uVar25) - 1) / uVar14 < uVar15) {
          __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x3f4,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        uVar25 = uVar25 - uVar15 * uVar14;
        uVar26 = uVar3 * uVar15 + uVar26;
      }
      __n = (long)(int)uVar3 * 8;
      memset(__s,0,__n);
      uVar17 = (long)(int)uVar3;
      for (; -1 < (int)uVar25; uVar25 = uVar25 - uVar14) {
        uVar15 = uVar25 >> 0xc;
        if (iVar5 < (int)uVar15) {
          __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x3fe,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        if (((int)uVar26 < 0) || (uVar13 = uVar26 + uVar3, iVar23 < (int)uVar13)) {
          __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x401,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        if (iVar22 < (int)uVar13) {
          __assert_fail("data_index + channels - 1 < filter->b_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x402,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        if (0 < (int)uVar3) {
          fVar1 = filter->coeffs[uVar15];
          fVar2 = filter->coeffs[(ulong)uVar15 + 1];
          pfVar7 = filter->buffer;
          uVar17 = 0;
          do {
            __s[uVar17] = (double)pfVar7[uVar26 + uVar17] *
                          ((double)(uVar25 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                          (double)fVar1) + __s[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar3 != uVar17);
        }
        uVar17 = (ulong)uVar3;
        uVar26 = uVar13;
      }
      iVar12 = (int)(iVar5 * 0x1000 - (uVar14 - iVar20)) / (int)uVar14;
      uVar25 = iVar12 * uVar14 + (uVar14 - iVar20);
      memset(__s_00,0,__n);
      uVar26 = (int)uVar25 >> 0xc;
      if (((int)uVar26 < 0) || (iVar5 < (int)uVar26)) {
LAB_001051a5:
        __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                      ,0x414,
                      "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                     );
      }
      uVar15 = (iVar12 + 1) * uVar3 + iVar24;
      pcVar8 = filter->coeffs;
      do {
        if (((int)uVar15 < 0) || (iVar23 < (int)(uVar3 + uVar15))) {
          __assert_fail("data_index >= 0 && data_index + channels - 1 < filter->b_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x416,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        if (iVar22 < (int)(uVar3 + uVar15)) {
          __assert_fail("data_index + channels - 1 < filter->b_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x417,
                        "void calc_output_multi(SINC_FILTER *, increment_t, increment_t, int, double, float *)"
                       );
        }
        if ((int)uVar3 < 1) {
          uVar26 = uVar25 - uVar14;
          bVar9 = (int)uVar25 < (int)uVar14;
          uVar25 = uVar26;
          if (uVar26 == 0 || bVar9) goto LAB_0010507d;
        }
        else {
          fVar1 = pcVar8[uVar26];
          fVar2 = pcVar8[(ulong)uVar26 + 1];
          pfVar7 = filter->buffer;
          uVar18 = 0;
          do {
            __s_00[uVar18] =
                 (double)pfVar7[uVar15 + uVar18] *
                 ((double)(uVar25 & 0xfff) * 0.000244140625 * (double)(fVar2 - fVar1) +
                 (double)fVar1) + __s_00[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar17 != uVar18);
          uVar26 = uVar25 - uVar14;
          bVar9 = (int)uVar25 < (int)uVar14;
          uVar25 = uVar26;
          if (uVar26 == 0 || bVar9) goto LAB_00105054;
        }
        uVar15 = uVar15 - uVar3;
        uVar26 = uVar25 >> 0xc;
        if (iVar5 < (int)uVar26) goto LAB_001051a5;
      } while( true );
    }
    goto LAB_00105118;
  }
  lVar19 = 0;
  lVar16 = 0;
LAB_0010512c:
  state->last_position = dVar34;
  state->last_ratio = dVar28;
  data->input_frames_used = lVar16 / lVar21;
  data->output_frames_gen = lVar19 / lVar21;
  return SRC_ERR_NO_ERROR;
LAB_00105054:
  uVar18 = 0;
  do {
    pfVar6[lVar21 + uVar18] =
         (float)((filter->left_calc[uVar18] + __s_00[uVar18]) * (dVar30 / (double)iVar4));
    uVar18 = uVar18 + 1;
  } while (uVar17 != uVar18);
LAB_0010507d:
  iVar4 = state->channels;
  uVar17 = (ulong)iVar4;
  dVar33 = dVar34 + 1.0 / dVar28;
  filter->out_gen = lVar21 + uVar17;
  dVar30 = dVar33 - (double)(int)ROUND(dVar33);
  auVar29._0_8_ = ~-(ulong)(dVar30 < 0.0) & (ulong)dVar30;
  auVar29._8_8_ = 0;
  auVar10._8_4_ = auVar35._8_4_;
  auVar10._0_8_ = (ulong)(dVar30 + 1.0) & -(ulong)(dVar30 < 0.0);
  auVar10._12_4_ = auVar35._12_4_;
  auVar35 = auVar29 | auVar10;
  dVar34 = auVar35._0_8_;
  lVar19 = (long)((int)ROUND(dVar33 - dVar34) * iVar4 + iVar24) % (long)iVar23;
  filter->b_current = (int)lVar19;
  if (lVar16 <= (long)(lVar21 + uVar17)) goto LAB_00105118;
  goto LAB_00104bf0;
LAB_00105118:
  lVar16 = filter->in_used;
  lVar19 = filter->out_gen;
  lVar21 = (long)state->channels;
  goto LAB_0010512c;
}

Assistant:

static SRC_ERROR
sinc_multichan_vari_process (SRC_STATE *state, SRC_DATA *data)
{	SINC_FILTER *filter ;
	double		input_index, src_ratio, count, float_increment, terminate, rem ;
	increment_t	increment, start_filter_index ;
	int			half_filter_chan_len, samples_in_hand ;

	if (state->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	filter = (SINC_FILTER*) state->private_data ;

	/* If there is not a problem, this will be optimised out. */
	if (sizeof (filter->buffer [0]) != sizeof (data->data_in [0]))
		return SRC_ERR_SIZE_INCOMPATIBILITY ;

	filter->in_count = data->input_frames * state->channels ;
	filter->out_count = data->output_frames * state->channels ;
	filter->in_used = filter->out_gen = 0 ;

	src_ratio = state->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	/* Check the sample rate ratio wrt the buffer len. */
	count = (filter->coeff_half_len + 2.0) / filter->index_inc ;
	if (MIN (state->last_ratio, data->src_ratio) < 1.0)
		count /= MIN (state->last_ratio, data->src_ratio) ;

	/* Maximum coefficientson either side of center point. */
	half_filter_chan_len = state->channels * (int) (psf_lrint (count) + 1) ;

	input_index = state->last_position ;

	rem = fmod_one (input_index) ;
	filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
	input_index = rem ;

	terminate = 1.0 / src_ratio + 1e-20 ;

	/* Main processing loop. */
	while (filter->out_gen < filter->out_count)
	{
		/* Need to reload buffer? */
		samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;

		if (samples_in_hand <= half_filter_chan_len)
		{	if ((state->error = prepare_data (filter, state->channels, data, half_filter_chan_len)) != 0)
				return state->error ;

			samples_in_hand = (filter->b_end - filter->b_current + filter->b_len) % filter->b_len ;
			if (samples_in_hand <= half_filter_chan_len)
				break ;
			} ;

		/* This is the termination condition. */
		if (filter->b_real_end >= 0)
		{	if (filter->b_current + input_index + terminate >= filter->b_real_end)
				break ;
			} ;

		if (filter->out_count > 0 && fabs (state->last_ratio - data->src_ratio) > 1e-10)
			src_ratio = state->last_ratio + filter->out_gen * (data->src_ratio - state->last_ratio) / filter->out_count ;

		float_increment = filter->index_inc * (src_ratio < 1.0 ? src_ratio : 1.0) ;
		increment = double_to_fp (float_increment) ;

		start_filter_index = double_to_fp (input_index * float_increment) ;

		calc_output_multi (filter, increment, start_filter_index, state->channels, float_increment / filter->index_inc, data->data_out + filter->out_gen) ;
		filter->out_gen += state->channels ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		filter->b_current = (filter->b_current + state->channels * psf_lrint (input_index - rem)) % filter->b_len ;
		input_index = rem ;
		} ;

	state->last_position = input_index ;

	/* Save current ratio rather then target ratio. */
	state->last_ratio = src_ratio ;

	data->input_frames_used = filter->in_used / state->channels ;
	data->output_frames_gen = filter->out_gen / state->channels ;

	return SRC_ERR_NO_ERROR ;
}